

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiInAlsa::initialize(MidiInAlsa *this,string *clientName)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 *puVar4;
  pthread_t pVar5;
  long lVar6;
  size_t __n;
  void *__s;
  string *psVar7;
  undefined8 uStack_70;
  string local_68;
  string local_48;
  undefined8 local_28;
  snd_seq_t *seq;
  
  uStack_70 = 0x10c091;
  iVar2 = snd_seq_open(&local_28,"default",3,1);
  if (iVar2 < 0) {
    psVar7 = &(this->super_MidiInApi).super_MidiApi.errorString_;
    uStack_70 = 0x10c172;
    std::__cxx11::string::assign((char *)psVar7);
    uStack_70 = 0x10c181;
    std::__cxx11::string::string((string *)&local_68,(string *)psVar7);
    uStack_70 = 0x10c18f;
    MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_68);
    psVar7 = &local_68;
  }
  else {
    uStack_70 = 0x10c0a5;
    snd_seq_set_client_name(local_28,(clientName->_M_dataplus)._M_p);
    uStack_70 = 0x10c0ad;
    puVar4 = (undefined8 *)operator_new(0x58);
    *puVar4 = local_28;
    puVar4[1] = 0xffffffffffffffff;
    puVar4[2] = 0;
    uStack_70 = 0x10c0c6;
    pVar5 = pthread_self();
    puVar4[7] = pVar5;
    puVar4[6] = pVar5;
    *(undefined8 *)((long)puVar4 + 0x4c) = 0xffffffffffffffff;
    (this->super_MidiInApi).super_MidiApi.apiData_ = puVar4;
    (this->super_MidiInApi).inputData_.apiData = puVar4;
    uStack_70 = 0x10c0e7;
    iVar2 = pipe((int *)((long)puVar4 + 0x4c));
    if (iVar2 != -1) {
      uStack_70 = 0x10c100;
      uVar3 = snd_seq_alloc_named_queue(local_28);
      *(undefined4 *)(puVar4 + 9) = uVar3;
      uStack_70 = 0x10c109;
      lVar6 = snd_seq_queue_tempo_sizeof();
      lVar6 = -(lVar6 + 0xfU & 0xfffffffffffffff0);
      __s = (void *)((long)&local_68 + lVar6);
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x10c11f;
      __n = snd_seq_queue_tempo_sizeof();
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x10c12c;
      memset(__s,0,__n);
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x10c139;
      snd_seq_queue_tempo_set_tempo(__s,600000);
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x10c146;
      snd_seq_queue_tempo_set_ppq(__s,0xf0);
      uVar1 = *puVar4;
      uVar3 = *(undefined4 *)(puVar4 + 9);
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x10c155;
      snd_seq_set_queue_tempo(uVar1,uVar3,__s);
      uVar1 = *puVar4;
      *(undefined8 *)((long)&uStack_70 + lVar6) = 0x10c15d;
      snd_seq_drain_output(uVar1);
      return;
    }
    psVar7 = &(this->super_MidiInApi).super_MidiApi.errorString_;
    uStack_70 = 0x10c1a8;
    std::__cxx11::string::assign((char *)psVar7);
    uStack_70 = 0x10c1b7;
    std::__cxx11::string::string((string *)&local_48,(string *)psVar7);
    uStack_70 = 0x10c1c5;
    MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_48);
    psVar7 = &local_48;
  }
  uStack_70 = 0x10c1ce;
  std::__cxx11::string::~string((string *)psVar7);
  return;
}

Assistant:

void MidiInAlsa :: initialize( const std::string& clientName )
{
  // Set up the ALSA sequencer client.
  snd_seq_t *seq;
  int result = snd_seq_open( &seq, "default", SND_SEQ_OPEN_DUPLEX, SND_SEQ_NONBLOCK );
  if ( result < 0 ) {
    errorString_ = "MidiInAlsa::initialize: error creating ALSA sequencer client object.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  // Set client name.
  snd_seq_set_client_name( seq, clientName.c_str() );

  // Save our api-specific connection information.
  AlsaMidiData *data = (AlsaMidiData *) new AlsaMidiData;
  data->seq = seq;
  data->portNum = -1;
  data->vport = -1;
  data->subscription = 0;
  data->dummy_thread_id = pthread_self();
  data->thread = data->dummy_thread_id;
  data->trigger_fds[0] = -1;
  data->trigger_fds[1] = -1;
  apiData_ = (void *) data;
  inputData_.apiData = (void *) data;

  if ( pipe(data->trigger_fds) == -1 ) {
    errorString_ = "MidiInAlsa::initialize: error creating pipe objects.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  // Create the input queue
#ifndef AVOID_TIMESTAMPING
  data->queue_id = snd_seq_alloc_named_queue( seq, "RtMidi Queue" );
  // Set arbitrary tempo (mm=100) and resolution (240)
  snd_seq_queue_tempo_t *qtempo;
  snd_seq_queue_tempo_alloca( &qtempo );
  snd_seq_queue_tempo_set_tempo( qtempo, 600000 );
  snd_seq_queue_tempo_set_ppq( qtempo, 240 );
  snd_seq_set_queue_tempo( data->seq, data->queue_id, qtempo );
  snd_seq_drain_output( data->seq );
#endif
}